

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4e5a3fa::GeneratorStateHelper::~GeneratorStateHelper(GeneratorStateHelper *this)

{
  JavascriptGenerator *this_00;
  bool bVar1;
  GeneratorStateHelper *this_local;
  
  this_00 = this->generator;
  bVar1 = IsDone(this);
  Js::JavascriptGenerator::SetState(this_00,(uint)bVar1 * 2 + Suspended);
  return;
}

Assistant:

~GeneratorStateHelper()
        {
            generator->SetState(IsDone() ? GeneratorState::Completed : GeneratorState::Suspended);
        }